

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_0::CWriter::InstallSegueBase(CWriter *this,Memory *memory,bool save_old_value)

{
  int iVar1;
  undefined7 in_register_00000011;
  Newline *u;
  Newline *u_00;
  Newline *u_01;
  Newline *u_02;
  Newline *u_03;
  char *pcVar2;
  int copy;
  ExternalInstanceRef primary_memory;
  ExternalInstanceRef local_50;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2543:7)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2543:7)>
             ::_M_manager;
  iVar1 = this->indent_;
  this->indent_ = 0;
  local_40._M_unused._M_object = this;
  std::
  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2543:7)>
  ::_M_invoke(&local_40);
  this->indent_ = iVar1;
  if ((int)CONCAT71(in_register_00000011,save_old_value) != 0) {
    this->indent_ = 0;
    (anonymous_namespace)::CWriter::Write<char_const(&)[32],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [32])"#if !WASM_RT_SEGUE_FREE_SEGMENT",u);
    this->indent_ = iVar1;
    pcVar2 = "void* segue_saved_base = wasm_rt_segue_read_base();";
    (anonymous_namespace)::CWriter::Write<char_const(&)[52],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [52])"void* segue_saved_base = wasm_rt_segue_read_base();",
               u_00);
    iVar1 = this->indent_;
    this->indent_ = 0;
    (anonymous_namespace)::CWriter::Write<char_const(&)[7],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [7])pcVar2,u_01);
    this->indent_ = iVar1;
  }
  local_50.super_GlobalName.type = Memory;
  local_50.super_GlobalName.name = &memory->name;
  WriteData(this,"wasm_rt_segue_write_base(",0x19);
  Write(this,&local_50);
  pcVar2 = ".data);";
  (anonymous_namespace)::CWriter::Write<char_const(&)[8],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [8])".data);",u_02);
  iVar1 = this->indent_;
  this->indent_ = 0;
  (anonymous_namespace)::CWriter::Write<char_const(&)[7],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [7])pcVar2,u_03);
  this->indent_ = iVar1;
  return;
}

Assistant:

void CWriter::InstallSegueBase(Memory* memory, bool save_old_value) {
  NonIndented(
      [&] { Write("#if WASM_RT_USE_SEGUE_FOR_THIS_MODULE", Newline()); });
  if (save_old_value) {
    NonIndented([&] { Write("#if !WASM_RT_SEGUE_FREE_SEGMENT", Newline()); });
    Write("void* segue_saved_base = wasm_rt_segue_read_base();", Newline());
    NonIndented([&] { Write("#endif", Newline()); });
  }
  auto primary_memory =
      ExternalInstanceRef(ModuleFieldType::Memory, memory->name);
  Write("wasm_rt_segue_write_base(", primary_memory, ".data);", Newline());
  NonIndented([&] { Write("#endif", Newline()); });
}